

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall
checkqueue_tests::test_CheckQueue_Correct_Max::test_method(test_CheckQueue_Correct_Max *this)

{
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> range;
  _Vector_impl_data in_stack_ffffffffffffffb8;
  unsigned_long local_30;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = 100000;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28,&local_30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28);
  CheckQueueTest::Correct_Queue_range
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,
             (vector<unsigned_long,_std::allocator<unsigned_long>_>)in_stack_ffffffffffffffb8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Correct_Max)
{
    std::vector<size_t> range;
    range.push_back(100000);
    Correct_Queue_range(range);
}